

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# entropy_coding.c
# Opt level: O3

int WebRtcIsac_DecodeSendBW(Bitstr *streamdata,int16_t *BWno)

{
  int iVar1;
  int BWno32;
  int16_t local_c [2];
  
  iVar1 = WebRtcIsac_DecHistOneStepMulti((int *)local_c,streamdata,kBwCdfPtr,kBwInitIndex,1);
  if (iVar1 < 0) {
    iVar1 = -0x19fa;
  }
  else {
    *BWno = local_c[0];
  }
  return iVar1;
}

Assistant:

int WebRtcIsac_DecodeSendBW(Bitstr* streamdata, int16_t* BWno) {
  int BWno32, err;

  /* entropy decoding of sender's BW estimation [0..23] */
  err = WebRtcIsac_DecHistOneStepMulti(&BWno32, streamdata, kBwCdfPtr,
                                       kBwInitIndex, 1);
  if (err < 0) {
    return -ISAC_RANGE_ERROR_DECODE_BANDWIDTH;
  }
  *BWno = (int16_t)BWno32;
  return err;
}